

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

int detectSwitch(istream *in)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  bool bVar3;
  little_int32_buf_t buf [2];
  int local_20;
  int local_1c;
  
  std::istream::seekg((long)in,_S_beg);
  iVar1 = std::istream::tellg();
  std::istream::seekg((long)in,4);
  std::istream::read((char *)in,(long)&local_20);
  std::istream::seekg((long)in,_S_beg);
  if ((local_1c != iVar1) && (bVar3 = local_20 != iVar1, local_20 = -1, bVar3)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to autodetect file type of ",0x22);
    pbVar2 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                        &currentFileName_abi_cxx11_);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar2,", guessing PS3",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
    std::ostream::put((char)pbVar2);
    std::ostream::flush();
  }
  return local_20;
}

Assistant:

static int detectSwitch(std::istream &in) {
	in.seekg(0, in.end);
	int size = in.tellg();
	in.seekg(4, in.beg);
	boost::endian::little_int32_buf_t buf[2];
	in.read((char *)buf, sizeof(buf));
	in.seekg(0, in.beg);
	if (buf[1].value() == size) {
		return buf[0].value();
	}
	else {
		if (buf[0].value() != size) {
			std::cerr << "Failed to autodetect file type of " << currentFileName << ", guessing PS3" << std::endl;
		}
		return -1;
	}
}